

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O2

int __thiscall
CDesign::GetWireInOverFlowBoundary
          (CDesign *this,
          hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
          *pWireList)

{
  CLayer *this_00;
  int i;
  int iLayer;
  
  for (iLayer = 1; iLayer <= (int)(this->super_CBBox).m_cMaxZ - (int)(this->super_CBBox).m_cMinZ;
      iLayer = iLayer + 1) {
    this_00 = GetLayer(this,iLayer);
    CLayer::GetWireInOverFlowBoundary(this_00,pWireList);
  }
  return (int)(pWireList->_M_ht)._M_num_elements;
}

Assistant:

int CDesign::GetWireInOverFlowBoundary(hash_map<ADDRESS,int>* pWireList)
{
	for (int i=LAYER_METAL1;i<=T();++i)	GetLayer(i)->GetWireInOverFlowBoundary(pWireList);

	return	pWireList->size();
}